

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSystemTools.cxx
# Opt level: O2

int testSystemTools(int param_1,char **param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  byte bVar49;
  FileTypeEnum FVar50;
  FileTypeEnum FVar51;
  FileTypeEnum FVar52;
  FileTypeEnum FVar53;
  int iVar54;
  int iVar55;
  __mode_t __mask;
  int iVar56;
  int iVar57;
  int iVar58;
  ostream *poVar59;
  unsigned_long uVar60;
  char *pcVar61;
  size_t sVar62;
  byte bVar63;
  byte bVar64;
  byte bVar65;
  byte bVar66;
  size_t size;
  size_type sVar67;
  char in_R8B;
  byte bVar68;
  long lVar69;
  byte bVar70;
  bool bVar71;
  bool bVar72;
  bool bVar73;
  bool local_3b1;
  string testNonExistingFile;
  string testDotFile;
  mode_t thisPerm;
  byte local_367;
  byte local_366;
  byte local_365;
  byte local_364;
  byte local_363;
  byte local_362;
  byte local_361;
  byte local_360;
  byte local_35f;
  byte local_35e;
  byte local_35d;
  byte local_35c;
  byte local_35b;
  byte local_35a;
  byte local_359;
  string testNewDir;
  string testBinFile;
  string testNewFile;
  allocator local_2e9;
  string testTxtFile;
  string testFileMissing;
  mode_t origPerm;
  string testFileMissingDir;
  string local_278;
  string result;
  byte abStack_238 [488];
  string output;
  
  local_3b1 = true;
  for (lVar69 = 8; lVar69 != 0xf8; lVar69 = lVar69 + 0x10) {
    std::__cxx11::string::string
              ((string *)&result,*(char **)((long)&PTR_anon_var_dwarf_47e2_00149b68 + lVar69),
               (allocator *)&testDotFile);
    std::__cxx11::string::string
              ((string *)&testNonExistingFile,*(char **)((long)toUnixPaths[0] + lVar69),
               (allocator *)&testBinFile);
    bVar4 = CheckConvertToUnixSlashes(&result,&testNonExistingFile);
    local_3b1 = bVar4 && local_3b1 != false;
    std::__cxx11::string::~string((string *)&testNonExistingFile);
    std::__cxx11::string::~string((string *)&result);
  }
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  bVar4 = cmsys::SystemTools::GetEnv("HOME",&output);
  if (bVar4) {
    std::__cxx11::string::append((char *)&output);
    std::__cxx11::string::string
              ((string *)&result,"~/foo bar/lala",(allocator *)&testNonExistingFile);
    bVar4 = CheckConvertToUnixSlashes(&result,&output);
    local_3b1 = bVar4 && local_3b1 != false;
    std::__cxx11::string::~string((string *)&result);
  }
  for (lVar69 = 0; lVar69 != 0x40; lVar69 = lVar69 + 0x20) {
    std::__cxx11::string::string
              ((string *)&testNonExistingFile,*(char **)((long)checkEscapeChars[0] + lVar69),
               (allocator *)&testBinFile);
    pcVar61 = *(char **)((long)checkEscapeChars[0] + lVar69 + 8);
    cVar2 = **(char **)((long)checkEscapeChars[0] + lVar69 + 0x10);
    std::__cxx11::string::string
              ((string *)&testDotFile,*(char **)((long)checkEscapeChars[0] + lVar69 + 0x18),
               (allocator *)&testTxtFile);
    cmsys::SystemTools::EscapeChars_abi_cxx11_
              (&result,(SystemTools *)testNonExistingFile._M_dataplus._M_p,pcVar61,
               (char *)(ulong)(uint)(int)cVar2,in_R8B);
    bVar4 = std::operator!=(&result,&testDotFile);
    if (bVar4) {
      poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with CheckEscapeChars - input: ");
      poVar59 = std::operator<<(poVar59,(string *)&testNonExistingFile);
      poVar59 = std::operator<<(poVar59," output: ");
      poVar59 = std::operator<<(poVar59,(string *)&result);
      poVar59 = std::operator<<(poVar59," expected: ");
      poVar59 = std::operator<<(poVar59,(string *)&testDotFile);
      std::endl<char,std::char_traits<char>>(poVar59);
    }
    std::__cxx11::string::~string((string *)&result);
    local_3b1 = (bool)(local_3b1 & !bVar4);
    std::__cxx11::string::~string((string *)&testDotFile);
    std::__cxx11::string::~string((string *)&testNonExistingFile);
  }
  std::__cxx11::string::string
            ((string *)&testNonExistingFile,
             "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/kwsys/testSystemToolsNonExistingFile"
             ,(allocator *)&result);
  std::__cxx11::string::string
            ((string *)&testDotFile,
             "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/kwsys/."
             ,(allocator *)&result);
  std::__cxx11::string::string
            ((string *)&testBinFile,
             "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/kwsys/testSystemTools.bin"
             ,(allocator *)&result);
  std::__cxx11::string::string
            ((string *)&testTxtFile,
             "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/kwsys/testSystemTools.cxx"
             ,(allocator *)&result);
  std::__cxx11::string::string
            ((string *)&testNewDir,
             "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/build_O2/Source/kwsys/testSystemToolsNewDir"
             ,(allocator *)&result);
  std::operator+(&testNewFile,&testNewDir,"/testNewFile.txt");
  FVar50 = cmsys::SystemTools::DetectFileType(testNonExistingFile._M_dataplus._M_p,0x100,0.05);
  if (FVar50 != FileTypeUnknown) {
    poVar59 = std::operator<<((ostream *)&std::cerr,
                              "Problem with DetectFileType - failed to detect type of: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNonExistingFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  FVar51 = cmsys::SystemTools::DetectFileType(testDotFile._M_dataplus._M_p,0x100,0.05);
  if (FVar51 != FileTypeUnknown) {
    poVar59 = std::operator<<((ostream *)&std::cerr,
                              "Problem with DetectFileType - failed to detect type of: ");
    poVar59 = std::operator<<(poVar59,(string *)&testDotFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  FVar52 = cmsys::SystemTools::DetectFileType(testBinFile._M_dataplus._M_p,0x100,0.05);
  if (FVar52 != FileTypeBinary) {
    poVar59 = std::operator<<((ostream *)&std::cerr,
                              "Problem with DetectFileType - failed to detect type of: ");
    poVar59 = std::operator<<(poVar59,(string *)&testBinFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  FVar53 = cmsys::SystemTools::DetectFileType(testTxtFile._M_dataplus._M_p,0x100,0.05);
  if (FVar53 != FileTypeText) {
    poVar59 = std::operator<<((ostream *)&std::cerr,
                              "Problem with DetectFileType - failed to detect type of: ");
    poVar59 = std::operator<<(poVar59,(string *)&testTxtFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  uVar60 = cmsys::SystemTools::FileLength(&testBinFile);
  if (uVar60 != 0x2fe) {
    poVar59 = std::operator<<((ostream *)&std::cerr,
                              "Problem with FileLength - incorrect length for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testBinFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  iVar54 = cmsys::SystemTools::Stat(testTxtFile._M_dataplus._M_p,(Stat_t *)&result);
  if (iVar54 != 0) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with Stat - unable to stat text file: "
                             );
    poVar59 = std::operator<<(poVar59,(string *)&testTxtFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  iVar55 = cmsys::SystemTools::Stat(&testBinFile,(Stat_t *)&result);
  if (iVar55 != 0) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with Stat - unable to stat bin file: ")
    ;
    poVar59 = std::operator<<(poVar59,(string *)&testBinFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar4 = cmsys::SystemTools::MakeDirectory(&testNewDir);
  if (!bVar4) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with MakeDirectory for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar5 = cmsys::SystemTools::MakeDirectory(&testNewDir);
  if (!bVar5) {
    poVar59 = std::operator<<((ostream *)&std::cerr,
                              "Problem with second call to MakeDirectory for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar6 = cmsys::SystemTools::MakeDirectory((char *)0x0);
  if (bVar6) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with MakeDirectory(0)");
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  paVar1 = &testFileMissing.field_2;
  testFileMissing._M_string_length = 0;
  testFileMissing.field_2._M_local_buf[0] = '\0';
  testFileMissing._M_dataplus._M_p = (pointer)paVar1;
  bVar7 = cmsys::SystemTools::MakeDirectory(&testFileMissing);
  std::__cxx11::string::~string((string *)&testFileMissing);
  if (bVar7) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with MakeDirectory(std::string())");
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar8 = cmsys::SystemTools::FileExists(testNewDir._M_dataplus._M_p,false);
  if (!bVar8) {
    poVar59 = std::operator<<((ostream *)&std::cerr,
                              "Problem with FileExists as C string and not file for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar9 = cmsys::SystemTools::PathExists(&testNewDir);
  if (!bVar9) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with PathExists for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar10 = cmsys::SystemTools::RemoveADirectory(&testNewDir);
  if (!bVar10) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with RemoveADirectory for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar11 = cmsys::SystemTools::FileExists(testNewDir._M_dataplus._M_p,false);
  if (bVar11) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"After RemoveADirectory: ");
    poVar59 = std::operator<<(poVar59,"Problem with FileExists as C string and not file for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar12 = cmsys::SystemTools::PathExists(&testNewDir);
  if (bVar12) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"After RemoveADirectory: ");
    poVar59 = std::operator<<(poVar59,"Problem with PathExists for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar13 = cmsys::SystemTools::MakeDirectory(testNewDir._M_dataplus._M_p);
  if (!bVar13) {
    poVar59 = std::operator<<((ostream *)&std::cerr,
                              "Problem with second call to MakeDirectory as C string for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  std::__cxx11::string::string
            ((string *)&testFileMissing,testNewFile._M_dataplus._M_p,
             (allocator *)&testFileMissingDir);
  bVar14 = cmsys::SystemTools::Touch(&testFileMissing,true);
  std::__cxx11::string::~string((string *)&testFileMissing);
  if (!bVar14) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with Touch for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar15 = cmsys::SystemTools::MakeDirectory(&testNewFile);
  if (bVar15) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with to MakeDirectory for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar16 = cmsys::SystemTools::FileExists((char *)0x0);
  if (bVar16) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with FileExists(0)");
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar17 = cmsys::SystemTools::FileExists((char *)0x0,true);
  if (bVar17) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with FileExists(0) as file");
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  testFileMissing._M_string_length = 0;
  testFileMissing.field_2._M_local_buf[0] = '\0';
  testFileMissing._M_dataplus._M_p = (pointer)paVar1;
  bVar18 = cmsys::SystemTools::FileExists(&testFileMissing);
  std::__cxx11::string::~string((string *)&testFileMissing);
  if (bVar18) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with FileExists(std::string())");
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar19 = cmsys::SystemTools::FileExists(&testNewDir,true);
  if (bVar19) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with FileExists as file for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar20 = cmsys::SystemTools::FileExists(testNewDir._M_dataplus._M_p,true);
  if (bVar20) {
    poVar59 = std::operator<<((ostream *)&std::cerr,
                              "Problem with FileExists as C string and file for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar21 = cmsys::SystemTools::FileExists(&testNewDir,false);
  if (!bVar21) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with FileExists as not file for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar22 = cmsys::SystemTools::FileExists(testNewDir._M_dataplus._M_p,false);
  if (!bVar22) {
    poVar59 = std::operator<<((ostream *)&std::cerr,
                              "Problem with FileExists as C string and not file for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar23 = cmsys::SystemTools::FileExists(&testNewFile);
  if (!bVar23) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with FileExists for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar24 = cmsys::SystemTools::FileExists(testNewFile._M_dataplus._M_p);
  if (!bVar24) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with FileExists as C string for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar25 = cmsys::SystemTools::FileExists(&testNewFile,true);
  if (!bVar25) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with FileExists as file for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar26 = cmsys::SystemTools::FileExists(testNewFile._M_dataplus._M_p,true);
  if (!bVar26) {
    poVar59 = std::operator<<((ostream *)&std::cerr,
                              "Problem with FileExists as C string and file for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  testFileMissing._M_string_length = 0;
  testFileMissing.field_2._M_local_buf[0] = '\0';
  testFileMissing._M_dataplus._M_p = (pointer)paVar1;
  bVar27 = cmsys::SystemTools::PathExists(&testFileMissing);
  std::__cxx11::string::~string((string *)&testFileMissing);
  if (bVar27) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with PathExists(std::string())");
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar28 = cmsys::SystemTools::PathExists(&testNewDir);
  if (!bVar28) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with PathExists for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar29 = cmsys::SystemTools::PathExists(&testNewFile);
  if (!bVar29) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with PathExists for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  __mask = umask(0x1ff);
  bVar30 = cmsys::SystemTools::GetPermissions(&testNewFile,&origPerm);
  if (!bVar30) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with GetPermissions (1) for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar31 = cmsys::SystemTools::SetPermissions(&testNewFile,0,false);
  if (!bVar31) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with SetPermissions (1) for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar32 = cmsys::SystemTools::GetPermissions(&testNewFile,&thisPerm);
  if (!bVar32) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with GetPermissions (2) for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar71 = (thisPerm & 0x1ff) != 0;
  if (bVar71) {
    poVar59 = std::operator<<((ostream *)&std::cerr,
                              "SetPermissions failed to set permissions (1) for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewFile);
    poVar59 = std::operator<<(poVar59,": actual = ");
    poVar59 = std::ostream::_M_insert<unsigned_long>((ulong)poVar59);
    poVar59 = std::operator<<(poVar59,"; expected = ");
    poVar59 = (ostream *)std::ostream::operator<<(poVar59,0);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar33 = cmsys::SystemTools::TestFileAccess(&testNewFile,2);
  if (bVar33) {
    poVar59 = std::operator<<((ostream *)&std::cerr,
                              "TestFileAccess incorrectly indicated that this is a writable file:");
    poVar59 = std::operator<<(poVar59,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar34 = cmsys::SystemTools::TestFileAccess(&testNewFile,0);
  if (!bVar34) {
    poVar59 = std::operator<<((ostream *)&std::cerr,
                              "TestFileAccess incorrectly indicated that this file does not exist:")
    ;
    poVar59 = std::operator<<(poVar59,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar35 = cmsys::SystemTools::SetPermissions(&testNewFile,0x1ff,false);
  if (!bVar35) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with SetPermissions (2) for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar36 = cmsys::SystemTools::GetPermissions(&testNewFile,&thisPerm);
  if (!bVar36) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with GetPermissions (3) for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar72 = (~thisPerm & 0x1ff) != 0;
  if (bVar72) {
    poVar59 = std::operator<<((ostream *)&std::cerr,
                              "SetPermissions failed to set permissions (2) for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewFile);
    poVar59 = std::operator<<(poVar59,": actual = ");
    poVar59 = std::ostream::_M_insert<unsigned_long>((ulong)poVar59);
    poVar59 = std::operator<<(poVar59,"; expected = ");
    poVar59 = std::ostream::_M_insert<unsigned_long>((ulong)poVar59);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar37 = cmsys::SystemTools::SetPermissions(&testNewFile,0x1ff,true);
  if (!bVar37) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with SetPermissions (3) for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar38 = cmsys::SystemTools::GetPermissions(&testNewFile,&thisPerm);
  if (!bVar38) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with GetPermissions (4) for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar73 = ((ushort)thisPerm & 0x1ff) != 0;
  if (bVar73) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"SetPermissions failed to honor umask for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewFile);
    poVar59 = std::operator<<(poVar59,": actual = ");
    poVar59 = std::ostream::_M_insert<unsigned_long>((ulong)poVar59);
    poVar59 = std::operator<<(poVar59,"; expected = ");
    poVar59 = (ostream *)std::ostream::operator<<(poVar59,0);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  umask(__mask);
  bVar39 = cmsys::SystemTools::SetPermissions(&testNewFile,origPerm,false);
  if (!bVar39) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with SetPermissions (4) for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar40 = cmsys::SystemTools::RemoveFile(&testNewFile);
  if (!bVar40) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with RemoveFile: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewFile);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  std::operator+(&testFileMissing,&testNewDir,"/testMissingFile.txt");
  bVar41 = cmsys::SystemTools::RemoveFile(&testFileMissing);
  if (!bVar41) {
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    poVar59 = std::operator<<((ostream *)&std::cerr,"RemoveFile(\"");
    poVar59 = std::operator<<(poVar59,(string *)&testFileMissing);
    poVar59 = std::operator<<(poVar59,"\") failed: ");
    poVar59 = std::operator<<(poVar59,(string *)&testFileMissingDir);
    std::operator<<(poVar59,"\n");
    std::__cxx11::string::~string((string *)&testFileMissingDir);
  }
  std::operator+(&testFileMissingDir,&testNewDir,"/missing/file.txt");
  bVar42 = cmsys::SystemTools::RemoveFile(&testFileMissingDir);
  if (!bVar42) {
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    poVar59 = std::operator<<((ostream *)&std::cerr,"RemoveFile(\"");
    poVar59 = std::operator<<(poVar59,(string *)&testFileMissingDir);
    poVar59 = std::operator<<(poVar59,"\") failed: ");
    poVar59 = std::operator<<(poVar59,(string *)&local_278);
    std::operator<<(poVar59,"\n");
    std::__cxx11::string::~string((string *)&local_278);
  }
  std::__cxx11::string::string((string *)&local_278,testNewFile._M_dataplus._M_p,&local_2e9);
  cmsys::SystemTools::Touch(&local_278,true);
  std::__cxx11::string::~string((string *)&local_278);
  bVar43 = cmsys::SystemTools::RemoveADirectory(&testNewDir);
  if (!bVar43) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with RemoveADirectory for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNewDir);
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  std::__cxx11::string::~string((string *)&testFileMissingDir);
  std::__cxx11::string::~string((string *)&testFileMissing);
  std::__cxx11::string::~string((string *)&testNewFile);
  std::__cxx11::string::~string((string *)&testNewDir);
  std::__cxx11::string::~string((string *)&testTxtFile);
  std::__cxx11::string::~string((string *)&testBinFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::string
            ((string *)&result,"mary had a little lamb.",(allocator *)&testNonExistingFile);
  cmsys::SystemTools::CapitalizedWords(&testNonExistingFile,&result);
  bVar44 = std::operator!=(&testNonExistingFile,"Mary Had A Little Lamb.");
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  if (bVar44) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with CapitalizedWords ");
    poVar59 = std::operator<<(poVar59,'\"');
    poVar59 = std::operator<<(poVar59,(string *)&result);
    poVar59 = std::operator<<(poVar59,'\"');
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  std::__cxx11::string::assign((char *)&result);
  cmsys::SystemTools::UnCapitalizedWords(&testNonExistingFile,&result);
  bVar45 = std::operator!=(&testNonExistingFile,"mary had a little lamb.");
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  if (bVar45) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with UnCapitalizedWords ");
    poVar59 = std::operator<<(poVar59,'\"');
    poVar59 = std::operator<<(poVar59,(string *)&result);
    poVar59 = std::operator<<(poVar59,'\"');
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  std::__cxx11::string::assign((char *)&result);
  cmsys::SystemTools::AddSpaceBetweenCapitalizedWords(&testNonExistingFile,&result);
  bVar46 = std::operator!=(&testNonExistingFile,"Mary Had The Little Lamb.");
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  if (bVar46) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with AddSpaceBetweenCapitalizedWords ")
    ;
    poVar59 = std::operator<<(poVar59,'\"');
    poVar59 = std::operator<<(poVar59,(string *)&result);
    poVar59 = std::operator<<(poVar59,'\"');
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  pcVar61 = cmsys::SystemTools::AppendStrings("Mary Had A"," Little Lamb.");
  iVar56 = strcmp(pcVar61,"Mary Had A Little Lamb.");
  if (iVar56 != 0) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with AppendStrings ");
    poVar59 = std::operator<<(poVar59,"\"Mary Had A\" \" Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  if (pcVar61 != (char *)0x0) {
    operator_delete__(pcVar61);
  }
  pcVar61 = cmsys::SystemTools::AppendStrings("Mary Had"," A ","Little Lamb.");
  iVar57 = strcmp(pcVar61,"Mary Had A Little Lamb.");
  if (iVar57 != 0) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with AppendStrings ");
    poVar59 = std::operator<<(poVar59,"\"Mary Had\" \" A \" \"Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  if (pcVar61 != (char *)0x0) {
    operator_delete__(pcVar61);
  }
  sVar62 = cmsys::SystemTools::CountChar("Mary Had A Little Lamb.",'a');
  if (sVar62 != 3) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with CountChar ");
    poVar59 = std::operator<<(poVar59,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  pcVar61 = cmsys::SystemTools::RemoveChars("Mary Had A Little Lamb.","aeiou");
  iVar58 = strcmp(pcVar61,"Mry Hd A Lttl Lmb.");
  if (iVar58 != 0) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with RemoveChars ");
    poVar59 = std::operator<<(poVar59,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar59);
  }
  bVar44 = iVar58 == 0 &&
           (sVar62 == 3 && (iVar57 == 0 && (iVar56 == 0 && (!bVar46 && (!bVar45 && !bVar44)))));
  if (pcVar61 != (char *)0x0) {
    operator_delete__(pcVar61);
  }
  pcVar61 = cmsys::SystemTools::RemoveCharsButUpperHex("Mary Had A Little Lamb.");
  if ((*pcVar61 != 'A') || (pcVar61[1] != '\0')) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with RemoveCharsButUpperHex ");
    poVar59 = std::operator<<(poVar59,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar59);
    bVar44 = false;
  }
  operator_delete__(pcVar61);
  pcVar61 = (char *)operator_new__(0x18);
  builtin_strncpy(pcVar61,"Mary Had A Little Lamb.",0x18);
  cmsys::SystemTools::ReplaceChars(pcVar61,"aeiou",'X');
  iVar56 = bcmp(pcVar61,"MXry HXd A LXttlX LXmb.",0x18);
  if (iVar56 != 0) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with ReplaceChars ");
    poVar59 = std::operator<<(poVar59,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar59);
    bVar44 = false;
  }
  operator_delete__(pcVar61);
  bVar45 = cmsys::SystemTools::StringStartsWith("Mary Had A Little Lamb.","Mary ");
  if (!bVar45) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with StringStartsWith ");
    poVar59 = std::operator<<(poVar59,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar59);
    bVar44 = false;
  }
  bVar45 = cmsys::SystemTools::StringEndsWith("Mary Had A Little Lamb."," Lamb.");
  if (!bVar45) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with StringEndsWith ");
    poVar59 = std::operator<<(poVar59,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar59);
    bVar44 = false;
  }
  pcVar61 = cmsys::SystemTools::DuplicateString("Mary Had A Little Lamb.");
  iVar56 = strcmp(pcVar61,"Mary Had A Little Lamb.");
  if (iVar56 != 0) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with DuplicateString ");
    poVar59 = std::operator<<(poVar59,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar59);
    bVar44 = false;
  }
  if (pcVar61 != (char *)0x0) {
    operator_delete__(pcVar61);
  }
  std::__cxx11::string::assign((char *)&result);
  cmsys::SystemTools::CropString(&testNonExistingFile,&result,0xd);
  bVar45 = std::operator!=(&testNonExistingFile,"Mary ...Lamb.");
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  if (bVar45) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with CropString ");
    poVar59 = std::operator<<(poVar59,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar59);
    bVar44 = false;
  }
  testBinFile._M_dataplus._M_p = (pointer)0x0;
  testBinFile._M_string_length = 0;
  testBinFile.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string
            ((string *)&testNonExistingFile,"Mary Had A Little Lamb.",(allocator *)&testDotFile);
  cmsys::SystemTools::Split
            (&testNonExistingFile,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&testBinFile,' ');
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  bVar45 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           testBinFile._M_dataplus._M_p,"Mary");
  if ((((bVar45) ||
       (bVar45 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(testBinFile._M_dataplus._M_p + 0x20),"Had"), bVar45)) ||
      (bVar45 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(testBinFile._M_dataplus._M_p + 0x40),"A"), bVar45)) ||
     ((bVar45 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(testBinFile._M_dataplus._M_p + 0x60),"Little"), bVar45 ||
      (bVar45 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(testBinFile._M_dataplus._M_p + 0x80),"Lamb."), bVar45)))) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with Split ");
    poVar59 = std::operator<<(poVar59,"\"Mary Had A Little Lamb.\"");
    std::endl<char,std::char_traits<char>>(poVar59);
    bVar44 = false;
  }
  std::__cxx11::string::string
            ((string *)&testDotFile,"L://Local Mojo/Hex Power Pack/Iffy Voodoo",
             (allocator *)&testTxtFile);
  cmsys::SystemTools::ConvertToWindowsOutputPath(&testNonExistingFile,&testDotFile);
  bVar45 = std::operator!=(&testNonExistingFile,"\"L:\\Local Mojo\\Hex Power Pack\\Iffy Voodoo\"");
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  if (bVar45) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with ConvertToWindowsOutputPath ");
    poVar59 = std::operator<<(poVar59,"\"L://Local Mojo/Hex Power Pack/Iffy Voodoo\"");
    std::endl<char,std::char_traits<char>>(poVar59);
    bVar44 = false;
  }
  std::__cxx11::string::string
            ((string *)&testDotFile,"//grayson/Local Mojo/Hex Power Pack/Iffy Voodoo",
             (allocator *)&testTxtFile);
  cmsys::SystemTools::ConvertToWindowsOutputPath(&testNonExistingFile,&testDotFile);
  bVar45 = std::operator!=(&testNonExistingFile,
                           "\"\\\\grayson\\Local Mojo\\Hex Power Pack\\Iffy Voodoo\"");
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  if (bVar45) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with ConvertToWindowsOutputPath ");
    poVar59 = std::operator<<(poVar59,"\"//grayson/Local Mojo/Hex Power Pack/Iffy Voodoo\"");
    std::endl<char,std::char_traits<char>>(poVar59);
    bVar44 = false;
  }
  std::__cxx11::string::string
            ((string *)&testDotFile,"//Local Mojo/Hex Power Pack/Iffy Voodoo",
             (allocator *)&testTxtFile);
  cmsys::SystemTools::ConvertToUnixOutputPath(&testNonExistingFile,&testDotFile);
  bVar45 = std::operator!=(&testNonExistingFile,"//Local\\ Mojo/Hex\\ Power\\ Pack/Iffy\\ Voodoo");
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  if (bVar45) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with ConvertToUnixOutputPath ");
    poVar59 = std::operator<<(poVar59,"\"//Local Mojo/Hex Power Pack/Iffy Voodoo\"");
    std::endl<char,std::char_traits<char>>(poVar59);
    bVar44 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&testBinFile);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string((string *)&result,"A=B",(allocator *)&testNonExistingFile);
  bVar45 = CheckPutEnv(&result,"A","B");
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string((string *)&result,"B=C",(allocator *)&testNonExistingFile);
  bVar46 = CheckPutEnv(&result,"B","C");
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string((string *)&result,"C=D",(allocator *)&testNonExistingFile);
  local_359 = CheckPutEnv(&result,"C","D");
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string((string *)&result,"D=E",(allocator *)&testNonExistingFile);
  local_35a = CheckPutEnv(&result,"D","E");
  std::__cxx11::string::~string((string *)&result);
  local_35b = CheckUnPutEnv("A","A");
  local_35c = CheckUnPutEnv("B=","B");
  local_35d = CheckUnPutEnv("C=D","C");
  std::__cxx11::string::string((string *)&result,"/usr/share",(allocator *)&testBinFile);
  std::__cxx11::string::string((string *)&testNonExistingFile,"/bin/bash",(allocator *)&testTxtFile)
  ;
  std::__cxx11::string::string((string *)&testDotFile,"../../bin/bash",(allocator *)&testNewDir);
  local_35e = CheckRelativePath(&result,&testNonExistingFile,&testDotFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string((string *)&result,"/usr/./share/",(allocator *)&testBinFile);
  std::__cxx11::string::string((string *)&testNonExistingFile,"/bin/bash",(allocator *)&testTxtFile)
  ;
  std::__cxx11::string::string((string *)&testDotFile,"../../bin/bash",(allocator *)&testNewDir);
  local_35f = CheckRelativePath(&result,&testNonExistingFile,&testDotFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string((string *)&result,"/usr//share/",(allocator *)&testBinFile);
  std::__cxx11::string::string((string *)&testNonExistingFile,"/bin/bash",(allocator *)&testTxtFile)
  ;
  std::__cxx11::string::string((string *)&testDotFile,"../../bin/bash",(allocator *)&testNewDir);
  local_360 = CheckRelativePath(&result,&testNonExistingFile,&testDotFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string((string *)&result,"/usr/share/../bin/",(allocator *)&testBinFile);
  std::__cxx11::string::string((string *)&testNonExistingFile,"/bin/bash",(allocator *)&testTxtFile)
  ;
  std::__cxx11::string::string((string *)&testDotFile,"../../bin/bash",(allocator *)&testNewDir);
  local_361 = CheckRelativePath(&result,&testNonExistingFile,&testDotFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string((string *)&result,"/usr/share",(allocator *)&testBinFile);
  std::__cxx11::string::string
            ((string *)&testNonExistingFile,"/usr/share//bin",(allocator *)&testTxtFile);
  std::__cxx11::string::string((string *)&testDotFile,"bin",(allocator *)&testNewDir);
  local_362 = CheckRelativePath(&result,&testNonExistingFile,&testDotFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string((string *)&result,"/usr/share/*",(allocator *)&testDotFile);
  std::__cxx11::string::string
            ((string *)&testNonExistingFile,"/usr/share/*",(allocator *)&testBinFile);
  local_363 = CheckCollapsePath(&result,&testNonExistingFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string((string *)&result,"C:/Windows/*",(allocator *)&testDotFile);
  std::__cxx11::string::string
            ((string *)&testNonExistingFile,"C:/Windows/*",(allocator *)&testBinFile);
  local_364 = CheckCollapsePath(&result,&testNonExistingFile);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&result);
  testBinFile._M_dataplus._M_p = (pointer)0x0;
  testBinFile._M_string_length = 0;
  testBinFile.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string
            ((string *)&result,"[HKEY_LOCAL_MACHINE\\SOFTWARE\\MyApp; MyKey]",
             (allocator *)&testNonExistingFile);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&testBinFile,
             &result);
  std::__cxx11::string::~string((string *)&result);
  testTxtFile._M_dataplus._M_p = (pointer)0x0;
  testTxtFile._M_string_length = 0;
  testTxtFile.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string
            ((string *)&result,"[HKEY_LOCAL_MACHINE\\SOFTWARE\\MyApp; MyKey]",
             (allocator *)&testNonExistingFile);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&testTxtFile,
             &result);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string
            ((string *)&result,"/Somewhere/something",(allocator *)&testNonExistingFile);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&testTxtFile,
             &result);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string((string *)&result,"/tmp",(allocator *)&testNonExistingFile);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&testTxtFile,
             &result);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string((string *)&testDotFile,"S",(allocator *)&testNewDir);
  std::operator+(&testNonExistingFile,&testDotFile,"=");
  std::operator+(&result,&testNonExistingFile,"/Somewhere/something:/tmp");
  bVar47 = CheckPutEnv(&result,"S","/Somewhere/something:/tmp");
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&testDotFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&testNewDir,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&testBinFile);
  cmsys::SystemTools::GetPath
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&testNewDir,"S");
  bVar48 = std::operator!=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&testNewDir,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&testTxtFile);
  if (bVar48) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"GetPath(");
    StringVectorToString
              (&result,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&testBinFile);
    poVar59 = std::operator<<(poVar59,(string *)&result);
    poVar59 = std::operator<<(poVar59,", ");
    poVar59 = std::operator<<(poVar59,"S");
    poVar59 = std::operator<<(poVar59,")  yielded ");
    StringVectorToString
              (&testNonExistingFile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&testNewDir);
    poVar59 = std::operator<<(poVar59,(string *)&testNonExistingFile);
    poVar59 = std::operator<<(poVar59," instead of ");
    StringVectorToString
              (&testDotFile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&testTxtFile);
    poVar59 = std::operator<<(poVar59,(string *)&testDotFile);
    std::endl<char,std::char_traits<char>>(poVar59);
    std::__cxx11::string::~string((string *)&testDotFile);
    std::__cxx11::string::~string((string *)&testNonExistingFile);
    std::__cxx11::string::~string((string *)&result);
    bVar47 = false;
  }
  local_365 = CheckUnPutEnv("S","S");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&testNewDir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&testTxtFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&testBinFile);
  std::__cxx11::string::string
            ((string *)&result,"testFindFile.txt",(allocator *)&testNonExistingFile);
  std::operator+(&testNonExistingFile,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/build_O2/Source/kwsys/"
                 ,&result);
  std::__cxx11::string::string
            ((string *)&testDotFile,testNonExistingFile._M_dataplus._M_p,(allocator *)&testBinFile);
  bVar48 = cmsys::SystemTools::Touch(&testDotFile,true);
  std::__cxx11::string::~string((string *)&testDotFile);
  if (bVar48) {
    testBinFile._M_dataplus._M_p = (pointer)0x0;
    testBinFile._M_string_length = 0;
    testBinFile.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string
              ((string *)&testDotFile,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/build_O2/Source/kwsys"
               ,(allocator *)&testTxtFile);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&testBinFile,
               &testDotFile);
    std::__cxx11::string::~string((string *)&testDotFile);
    cmsys::SystemTools::FindFile
              (&testDotFile,&result,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&testBinFile,true);
    sVar67 = testDotFile._M_string_length;
    std::__cxx11::string::~string((string *)&testDotFile);
    if (sVar67 == 0) {
      poVar59 = std::operator<<((ostream *)&std::cerr,
                                "Problem with FindFile without system paths for: ");
      poVar59 = std::operator<<(poVar59,(string *)&result);
      std::endl<char,std::char_traits<char>>(poVar59);
    }
    cmsys::SystemTools::FindFile
              (&testDotFile,&result,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&testBinFile,false);
    sVar3 = testDotFile._M_string_length;
    std::__cxx11::string::~string((string *)&testDotFile);
    if (sVar3 == 0) {
      poVar59 = std::operator<<((ostream *)&std::cerr,
                                "Problem with FindFile with system paths for: ");
      poVar59 = std::operator<<(poVar59,(string *)&result);
      std::endl<char,std::char_traits<char>>(poVar59);
    }
    bVar48 = sVar3 != 0 && sVar67 != 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&testBinFile);
  }
  else {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem with Touch for: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNonExistingFile);
    std::endl<char,std::char_traits<char>>(poVar59);
    bVar48 = false;
  }
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::string
            ((string *)&testNonExistingFile,
             "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/kwsys/README.rst"
             ,(allocator *)&result);
  std::ifstream::ifstream(&result,testNonExistingFile._M_dataplus._M_p,_S_in);
  local_367 = bVar46;
  local_366 = bVar45;
  if ((abStack_238[*(long *)(result._M_dataplus._M_p + -0x18)] & 5) != 0) {
    poVar59 = std::operator<<((ostream *)&std::cerr,"Problem opening: ");
    poVar59 = std::operator<<(poVar59,(string *)&testNonExistingFile);
    std::endl<char,std::char_traits<char>>(poVar59);
    bVar68 = 0;
    goto LAB_00120cad;
  }
  testDotFile._M_dataplus._M_p = (pointer)&testDotFile.field_2;
  testDotFile._M_string_length = 0;
  testDotFile.field_2._M_local_buf[0] = '\0';
  testBinFile._M_dataplus._M_p = testBinFile._M_dataplus._M_p & 0xffffffffffffff00;
  std::istream::seekg((long)&result,_S_beg);
  bVar45 = cmsys::SystemTools::GetLineFromStream
                     ((istream *)&result,&testDotFile,(bool *)&testBinFile,-1);
  if (bVar45 && testDotFile._M_string_length == 5) {
    std::istream::seekg((long)&result,_S_beg);
    bVar45 = cmsys::SystemTools::GetLineFromStream
                       ((istream *)&result,&testDotFile,(bool *)&testBinFile,-1);
    if (!bVar45 || testDotFile._M_string_length != 5) {
      pcVar61 = "First line does not have five characters after rewind: ";
      goto LAB_00120c7f;
    }
    bVar68 = 1;
    for (sVar67 = 1; sVar67 != 6; sVar67 = sVar67 + 1) {
      std::istream::seekg((long)&result,_S_beg);
      bVar45 = cmsys::SystemTools::GetLineFromStream
                         ((istream *)&result,&testDotFile,(bool *)&testBinFile,sVar67);
      if (!bVar45 || sVar67 != testDotFile._M_string_length) {
        poVar59 = std::operator<<((ostream *)&std::cerr,"Should have read ");
        poVar59 = std::ostream::_M_insert<unsigned_long>((ulong)poVar59);
        poVar59 = std::operator<<(poVar59," characters but got ");
        poVar59 = std::ostream::_M_insert<unsigned_long>((ulong)poVar59);
        std::endl<char,std::char_traits<char>>(poVar59);
        bVar68 = 0;
      }
    }
  }
  else {
    pcVar61 = "First line does not have five characters: ";
LAB_00120c7f:
    poVar59 = std::operator<<((ostream *)&std::cerr,pcVar61);
    poVar59 = std::ostream::_M_insert<unsigned_long>((ulong)poVar59);
    std::endl<char,std::char_traits<char>>(poVar59);
    bVar68 = 0;
  }
  std::__cxx11::string::~string((string *)&testDotFile);
LAB_00120cad:
  bVar70 = bVar47 & local_365;
  bVar63 = local_363 & local_364;
  bVar66 = local_360 & local_361 & local_35e & local_35f & local_362;
  bVar49 = local_366 & local_367;
  bVar64 = local_359 & local_35a;
  bVar65 = local_35b & local_35c & local_35d;
  std::ifstream::~ifstream(&result);
  std::__cxx11::string::~string((string *)&testNonExistingFile);
  std::__cxx11::string::~string((string *)&output);
  return (uint)(byte)(local_3b1 & bVar70 & bVar48 & bVar68 &
                      (bVar43 &&
                      (bVar42 &&
                      (bVar41 &&
                      (bVar40 &&
                      (bVar39 &&
                      (!bVar73 &&
                      (bVar38 &&
                      (bVar37 &&
                      (!bVar72 &&
                      (bVar36 &&
                      (bVar35 &&
                      (bVar34 &&
                      (!bVar33 &&
                      (!bVar71 &&
                      (bVar32 &&
                      (bVar31 &&
                      (bVar30 &&
                      (bVar29 &&
                      (bVar28 &&
                      (!bVar27 &&
                      (bVar26 &&
                      (bVar25 &&
                      (bVar24 &&
                      (bVar23 &&
                      (bVar22 &&
                      (bVar21 &&
                      (!bVar20 &&
                      (!bVar19 &&
                      (!bVar18 &&
                      (!bVar17 &&
                      (!bVar16 &&
                      (!bVar15 &&
                      (bVar14 &&
                      (bVar13 &&
                      (!bVar12 &&
                      (!bVar11 &&
                      (bVar10 &&
                      (bVar9 && (bVar8 && (!bVar7 &&
                                          (!bVar6 &&
                                          (bVar5 && (bVar4 && (iVar55 == 0 &&
                                                              (iVar54 == 0 &&
                                                              (uVar60 == 0x2fe &&
                                                              (FVar53 == FileTypeText &&
                                                              (FVar52 == FileTypeBinary &&
                                                              (FVar51 == FileTypeUnknown &&
                                                              FVar50 == FileTypeUnknown)))))))))))))
                      )))))))))))))))))))))))))))))))))))) & bVar44 & bVar65 & bVar64 & bVar49 &
                      bVar66 & bVar63 ^ 1);
}

Assistant:

int testSystemTools(int, char* [])
{
  bool res = true;

  int cc;
  for (cc = 0; toUnixPaths[cc][0]; cc++) {
    res &= CheckConvertToUnixSlashes(toUnixPaths[cc][0], toUnixPaths[cc][1]);
  }

  // Special check for ~
  std::string output;
  if (kwsys::SystemTools::GetEnv("HOME", output)) {
    output += "/foo bar/lala";
    res &= CheckConvertToUnixSlashes("~/foo bar/lala", output);
  }

  for (cc = 0; checkEscapeChars[cc][0]; cc++) {
    res &= CheckEscapeChars(checkEscapeChars[cc][0], checkEscapeChars[cc][1],
                            *checkEscapeChars[cc][2], checkEscapeChars[cc][3]);
  }

  res &= CheckFileOperations();

  res &= CheckStringOperations();

  res &= CheckEnvironmentOperations();

  res &= CheckRelativePaths();

  res &= CheckCollapsePath();

  res &= CheckGetPath();

  res &= CheckFind();

  res &= CheckGetLineFromStream();

  return res ? 0 : 1;
}